

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  Iio *pIVar2;
  ostream *poVar3;
  float fVar4;
  allocator<char> local_261;
  string attr_name;
  IioTestHandler testHandler;
  string deviceName;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  testHandler.super_IioHandler._vptr_IioHandler = (IioHandler)&PTR_onIioEvent_00106d30;
  deviceName._M_dataplus._M_p = (pointer)&deviceName.field_2;
  deviceName._M_string_length = 0;
  deviceName.field_2._M_local_buf[0] = '\0';
  pIVar2 = (Iio *)operator_new(8);
  mraa::Iio::Iio(pIVar2,0);
  poVar3 = std::operator<<((ostream *)&std::cout,"IIO device 0 found by id.");
  std::endl<char,std::char_traits<char>>(poVar3);
  mraa::Iio::getDeviceName_abi_cxx11_(&attr_name,pIVar2);
  std::__cxx11::string::operator=((string *)&deviceName,(string *)&attr_name);
  std::__cxx11::string::~string((string *)&attr_name);
  mraa::Iio::~Iio(pIVar2);
  operator_delete(pIVar2,8);
  pIVar2 = (Iio *)operator_new(8);
  mraa::Iio::Iio(pIVar2,1);
  mraa::Iio::~Iio(pIVar2);
  operator_delete(pIVar2,8);
  pIVar2 = (Iio *)operator_new(8);
  mraa::Iio::Iio(pIVar2,&deviceName);
  iio_device = pIVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,"IIO device 0 found by name.");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Using IIO device0. Name is ");
  mraa::Iio::getDeviceName_abi_cxx11_(&attr_name,iio_device);
  poVar3 = std::operator<<(poVar3,(string *)&attr_name);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&attr_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attr_name,"in_accel_x_raw",&local_261);
  mraa::Iio::writeFloat(iio_device,&attr_name,100.0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"writeFloat",&local_261);
  std::__cxx11::string::string((string *)&local_58,(string *)&attr_name);
  log_result(&local_38,&local_58,false,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&attr_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attr_name,"in_voltage0_scale",&local_261);
  mraa::Iio::writeFloat(iio_device,&attr_name,100.0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"writeFloat",&local_261);
  std::__cxx11::string::string((string *)&local_98,(string *)&attr_name);
  log_result(&local_78,&local_98,false,true);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&attr_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attr_name,"out_voltage0_raw",&local_261);
  mraa::Iio::writeInt(iio_device,&attr_name,100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"writeInt",&local_261);
  std::__cxx11::string::string((string *)&local_d8,(string *)&attr_name);
  log_result(&local_b8,&local_d8,true,true);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&attr_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attr_name,"in_accel_x_raw",&local_261);
  iVar1 = mraa::Iio::readInt(iio_device,&attr_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"readInt",&local_261);
  std::__cxx11::string::string((string *)&local_118,(string *)&attr_name);
  log_result(&local_f8,&local_118,true,ABS((double)(iVar1 + -0x22)) < 1.1920928955078125e-07);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&attr_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attr_name,"in_voltage0_scale",&local_261);
  fVar4 = mraa::Iio::readFloat(iio_device,&attr_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"readFloat",&local_261);
  std::__cxx11::string::string((string *)&local_158,(string *)&attr_name);
  log_result(&local_138,&local_158,true,ABS(fVar4 + -0.001333) < 1.1920929e-07);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&attr_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attr_name,"events/in_voltage0_thresh_rising_en",&local_261);
  mraa::Iio::writeInt(iio_device,&attr_name,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"writeInt",&local_261);
  std::__cxx11::string::string((string *)&local_198,(string *)&attr_name);
  log_result(&local_178,&local_198,true,true);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&attr_name);
  mraa::Iio::registerEventHandler(iio_device,&testHandler.super_IioHandler);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"registerEventHandler(&testHandler)",(allocator<char> *)&attr_name
            );
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_261);
  log_result(&local_1b8,&local_1d8,true,true);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  eventCount = 0;
  generate_event();
  usleep(500000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"eventReceived",(allocator<char> *)&attr_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_261);
  log_result(&local_1f8,&local_218,eventCount == 1,true);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  pIVar2 = iio_device;
  if (iio_device != (Iio *)0x0) {
    mraa::Iio::~Iio(iio_device);
  }
  operator_delete(pIVar2,8);
  std::__cxx11::string::~string((string *)&deviceName);
  return 0;
}

Assistant:

int
main(void)
{
    //! [Interesting]
    IioTestHandler testHandler;
    std::string deviceName;
    try {
        mraa::Iio* iio_device0 = new mraa::Iio(0);
        std::cout << "IIO device 0 found by id." << std::endl;
        deviceName = iio_device0->getDeviceName();
        delete iio_device0;
    } catch (std::exception& e) {
        std::cerr << "IIO device 0 not found." << std::endl;
        return EXIT_FAILURE;
    }

    try {
        mraa::Iio* iio_device1 = new mraa::Iio(1);
        delete iio_device1;
    } catch (std::exception& e) {
        std::cerr << "IIO device 1 not found. This is expected behavior." << std::endl;
    }

    try {
        iio_device = new mraa::Iio(deviceName);
        std::cout << "IIO device 0 found by name." << std::endl;
    } catch (std::exception& e) {
        std::cerr << "IIO device 0 not found." << std::endl;
        return EXIT_FAILURE;
    }

    std::cout << "Using IIO device0. Name is " << iio_device->getDeviceName() << std::endl;
    IIO_RUN(writeFloat, "in_accel_x_raw", 100, EXPECT_FAILURE);
    IIO_RUN(writeFloat, "in_voltage0_scale", 100, EXPECT_FAILURE);
    IIO_RUN(writeInt, "out_voltage0_raw", 100, EXPECT_SUCCESS);
    IIO_TEST(readInt, "in_accel_x_raw", 34, EXPECT_SUCCESS);
    IIO_TEST(readFloat, "in_voltage0_scale", 0.001333, EXPECT_SUCCESS);
    IIO_RUN(writeInt, "events/in_voltage0_thresh_rising_en", 1, EXPECT_SUCCESS);
    IIO_TRY(registerEventHandler(&testHandler));
    eventCount = 0;
    generate_event();
    usleep(500000);
    log_result("eventReceived", "", (eventCount == 1), true);
    //! [Interesting]

    delete iio_device;

    return EXIT_SUCCESS;
}